

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_is_float(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint iBool;
  
  if (nArg < 1) {
    iBool = 0;
  }
  else {
    iBool = (uint)(*apArg)->iFlags >> 2 & 1;
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Builtin_is_float(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int res = 0; /* Assume false by default */
	if( nArg > 0 ){
		res = jx9_value_is_float(apArg[0]);
	}
	/* Query result */
	jx9_result_bool(pCtx, res);
	return JX9_OK;
}